

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O3

size_t mdns_discovery_recv(int sock,void *buffer,size_t capacity,mdns_record_callback_fn callback,
                          void *user_data)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  void *user_data_00;
  mdns_record_callback_fn callback_00;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  ssize_t sVar7;
  size_t sVar8;
  ushort *puVar9;
  uint uVar10;
  long lVar11;
  ulong size_lhs;
  bool bVar12;
  size_t offset;
  long local_88;
  size_t verify_ofs;
  uint local_74;
  void *local_70;
  mdns_record_callback_fn local_68;
  socklen_t addrlen;
  sockaddr_in6 addr;
  
  addr.sin6_addr.__in6_u.__u6_addr32[0] = 0;
  addr.sin6_addr.__in6_u.__u6_addr32[1] = 0;
  addr.sin6_addr.__in6_u.__u6_addr32[2] = 0;
  addr._20_8_ = 0;
  addr.sin6_family = 2;
  addr.sin6_port = 0;
  addr.sin6_flowinfo = 0;
  addrlen = 0x1c;
  local_70 = user_data;
  local_68 = callback;
  sVar7 = recvfrom(sock,buffer,capacity,0,(sockaddr *)&addr,&addrlen);
  if ((((0 < (int)(uint)sVar7) && (*buffer == 0)) && (*(short *)((long)buffer + 2) == 0x84)) &&
     (uVar4 = *(ushort *)((long)buffer + 4) << 8 | *(ushort *)((long)buffer + 4) >> 8, uVar4 < 2)) {
    size_lhs = (ulong)((uint)sVar7 & 0x7fffffff);
    uVar1 = *(ushort *)((long)buffer + 6);
    local_88 = CONCAT62(local_88._2_6_,uVar1);
    local_74 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
    uVar1 = *(ushort *)((long)buffer + 8);
    uVar2 = *(ushort *)((long)buffer + 10);
    lVar11 = (long)buffer + 0xc;
    uVar5 = 0;
    do {
      if (uVar4 <= uVar5) {
        if ((short)local_88 == 0) {
          local_88 = 0;
        }
        else {
          bVar12 = true;
          uVar10 = 1;
          if (1 < (ushort)local_74) {
            uVar10 = local_74;
          }
          uVar10 = uVar10 & 0xffff;
          local_88 = 0;
          do {
            offset = lVar11 - (long)buffer;
            verify_ofs = 0xc;
            iVar6 = mdns_string_equal(buffer,size_lhs,&offset,"",0x2e,&verify_ofs);
            sVar8 = offset + 10;
            uVar4 = *(ushort *)((long)buffer + offset + 8);
            uVar4 = uVar4 << 8 | uVar4 >> 8;
            if ((iVar6 != 0) && (bVar12)) {
              puVar9 = (ushort *)(offset + (long)buffer);
              uVar3 = *(uint *)(puVar9 + 2);
              local_88 = local_88 + 1;
              iVar6 = (*local_68)((sockaddr *)&addr,MDNS_ENTRYTYPE_ANSWER,
                                  *puVar9 << 8 | *puVar9 >> 8,puVar9[1] << 8 | puVar9[1] >> 8,
                                  uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                  uVar3 << 0x18,buffer,size_lhs,sVar8,(size_t)uVar4,local_70);
              bVar12 = iVar6 == 0;
            }
            lVar11 = (long)buffer + uVar4 + sVar8;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
        }
        callback_00 = local_68;
        user_data_00 = local_70;
        offset = lVar11 - (long)buffer;
        sVar8 = mdns_records_parse((sockaddr *)&addr,buffer,size_lhs,&offset,
                                   MDNS_ENTRYTYPE_AUTHORITY,(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8)
                                   ,local_68,local_70);
        lVar11 = sVar8 + local_88;
        sVar8 = mdns_records_parse((sockaddr *)&addr,buffer,size_lhs,&offset,
                                   MDNS_ENTRYTYPE_ADDITIONAL,
                                   (ulong)(ushort)(uVar2 << 8 | uVar2 >> 8),callback_00,user_data_00
                                  );
        return sVar8 + lVar11;
      }
      offset = lVar11 - (long)buffer;
      verify_ofs = 0xc;
      iVar6 = mdns_string_equal(buffer,size_lhs,&offset,"",0x2e,&verify_ofs);
      if (iVar6 == 0) {
        return 0;
      }
      if (*(short *)((long)buffer + offset) != 0xc00) {
        return 0;
      }
      lVar11 = (long)buffer + offset + 4;
      uVar5 = 1;
    } while ((*(ushort *)((long)buffer + offset + 2) & 0xff7f) == 0x100);
  }
  return 0;
}

Assistant:

size_t
mdns_discovery_recv(int sock, void* buffer, size_t capacity,
                    mdns_record_callback_fn callback, void* user_data) {
	struct sockaddr_in6 addr;
	struct sockaddr* saddr = (struct sockaddr*)&addr;
	memset(&addr, 0, sizeof(addr));
	saddr->sa_family = AF_INET;
#ifdef __APPLE__
	saddr->sa_len = sizeof(addr);
#endif
	socklen_t addrlen = sizeof(addr);
	int ret = recvfrom(sock, buffer, capacity, 0,
	                   saddr, &addrlen);
	if (ret <= 0)
		return 0;

	size_t data_size = (size_t)ret;
	size_t records = 0;
	uint16_t* data = (uint16_t*)buffer;

	uint16_t transaction_id = ntohs(*data++);
	uint16_t flags          = ntohs(*data++);
	uint16_t questions      = ntohs(*data++);
	uint16_t answer_rrs     = ntohs(*data++);
	uint16_t authority_rrs  = ntohs(*data++);
	uint16_t additional_rrs = ntohs(*data++);

	if (transaction_id || (flags != 0x8400))
		return 0; //Not a reply to our question

	if (questions > 1)
		return 0;

	int i;
	for (i = 0; i < questions; ++i) {
		size_t ofs = (size_t)((char*)data - (char*)buffer);
		size_t verify_ofs = 12;
		//Verify it's our question, _services._dns-sd._udp.local.
		if (!mdns_string_equal(buffer, data_size, &ofs,
		                       mdns_services_query, sizeof(mdns_services_query), &verify_ofs))
			return 0;
		data = (uint16_t*)((char*)buffer + ofs);

		uint16_t type = ntohs(*data++);
		uint16_t rclass = ntohs(*data++);

		//Make sure we get a reply based on our PTR question for class IN
		if ((type != MDNS_RECORDTYPE_PTR) || ((rclass & 0x7FFF) != MDNS_CLASS_IN))
			return 0;
	}

	int do_callback = 1;
	for (i = 0; i < answer_rrs; ++i) {
		size_t ofs = (size_t)((char*)data - (char*)buffer);
		size_t verify_ofs = 12;
		//Verify it's an answer to our question, _services._dns-sd._udp.local.
		int is_answer = mdns_string_equal(buffer, data_size, &ofs,
		                                  mdns_services_query, sizeof(mdns_services_query), &verify_ofs);
		data = (uint16_t*)((char*)buffer + ofs);

		uint16_t type = ntohs(*data++);
		uint16_t rclass = ntohs(*data++);
		uint32_t ttl = ntohl(*(uint32_t*)(void*)data); data += 2;
		uint16_t length = ntohs(*data++);

		if (is_answer && do_callback) {
			++records;
			if (callback(saddr, MDNS_ENTRYTYPE_ANSWER, type, rclass, ttl, buffer,
			             data_size, (size_t)((char*)data - (char*)buffer), length,
			             user_data))
				do_callback = 0;
		}
		data = (uint16_t*)((char*)data + length);
	}

	size_t offset = (size_t)((char*)data - (char*)buffer);
	records += mdns_records_parse(saddr, buffer, data_size, &offset,
	                              MDNS_ENTRYTYPE_AUTHORITY, authority_rrs, 
	                              callback, user_data);
	records += mdns_records_parse(saddr, buffer, data_size, &offset,
	                              MDNS_ENTRYTYPE_ADDITIONAL, additional_rrs, 
	                              callback, user_data);

	return records;
}